

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::BadNameString::BadNameString(BadNameString *this,string *msg)

{
  string *in_RSI;
  string *in_RDI;
  BadNameString *unaff_retaddr;
  string local_68 [55];
  allocator local_31;
  string local_30 [28];
  ExitCodes in_stack_ffffffffffffffec;
  string *msg_00;
  
  msg_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_30,"BadNameString",&local_31);
  ::std::__cxx11::string::string(local_68,(string *)in_RSI);
  BadNameString(unaff_retaddr,in_RDI,msg_00,in_stack_ffffffffffffffec);
  ::std::__cxx11::string::~string(local_68);
  ::std::__cxx11::string::~string(local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

static BadNameString MissingDash(std::string name) {
        return BadNameString("Long names strings require 2 dashes " + name);
    }